

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O1

void __thiscall TasGrid::GridGlobal::loadNeededValues(GridGlobal *this,double *vals)

{
  CudaGlobalData<double> *this_00;
  
  this_00 = (this->gpu_cache)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
            .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
  if (this_00 != (CudaGlobalData<double> *)0x0) {
    GpuVector<double>::clear(&this_00->values);
  }
  if (((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish) ||
     ((this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    StorageSet::setValues(&(this->super_BaseCanonicalGrid).values,vals);
  }
  else {
    StorageSet::addValues
              (&(this->super_BaseCanonicalGrid).values,&(this->super_BaseCanonicalGrid).points,
               &(this->super_BaseCanonicalGrid).needed,vals);
  }
  acceptUpdatedTensors(this);
  return;
}

Assistant:

void GridGlobal::loadNeededValues(const double *vals){
    clearGpuValues();
    if (points.empty() || needed.empty()){
        values.setValues(vals);
    }else{
        values.addValues(points, needed, vals);
    }
    acceptUpdatedTensors();
}